

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lace.h
# Opt level: O0

void lace_leapfrog(WorkerP *__lace_worker,Task *__lace_dq_head)

{
  Task *__dq_head;
  Worker *pWVar1;
  _Task *p_Var2;
  Worker *wt;
  Worker *res;
  __pointer_type p_Stack_38;
  int attempts;
  Worker *thief;
  Task *t;
  Task *__lace_dq_head_local;
  WorkerP *__lace_worker_local;
  
  p_Stack_38 = std::atomic::operator_cast_to__Worker_((atomic *)&__lace_dq_head->thief);
  if (p_Stack_38 != (__pointer_type)&DAT_00000002) {
    while (p_Stack_38 < (__pointer_type)&DAT_00000002) {
      p_Stack_38 = std::atomic::operator_cast_to__Worker_((atomic *)&__lace_dq_head->thief);
    }
    __dq_head = __lace_dq_head + 1;
    res._4_4_ = 0x20;
    while (p_Stack_38 != (Worker *)&DAT_00000002) {
      pWVar1 = lace_steal(__lace_worker,__dq_head,p_Stack_38);
      if (pWVar1 == (Worker *)&DAT_00000002) {
        p_Var2 = std::atomic_load_explicit<_Task*>
                           ((atomic<_Task_*> *)&lace_newframe,memory_order_relaxed);
        if (p_Var2 != (_Task *)0x0) {
          lace_yield(__lace_worker,__dq_head);
        }
        res._4_4_ = res._4_4_ + -1;
        if (res._4_4_ == 0) {
          lace_steal_random_CALL(__lace_worker,__dq_head);
          res._4_4_ = 0x20;
        }
      }
      p_Stack_38 = std::atomic::operator_cast_to__Worker_((atomic *)&__lace_dq_head->thief);
    }
    if (__lace_worker->allstolen == '\0') {
      __lace_worker->_public->allstolen = '\x01';
      __lace_worker->allstolen = '\x01';
    }
  }
  std::atomic_store_explicit<_Worker*>
            (&__lace_dq_head->thief,(__atomic_val_t<_Worker_*>)0x0,memory_order_relaxed);
  return;
}

Assistant:

static inline void
lace_leapfrog(WorkerP *__lace_worker, Task *__lace_dq_head)
{
    lace_time_event(__lace_worker, 3);
    Task *t = __lace_dq_head;
    Worker *thief = t->thief;
    if (thief != THIEF_COMPLETED) {
        while ((size_t)thief <= 1) thief = t->thief;

        /* PRE-LEAP: increase head again */
        __lace_dq_head += 1;

        /* Now leapfrog */
        int attempts = 32;
        while (thief != THIEF_COMPLETED) {
            PR_COUNTSTEALS(__lace_worker, CTR_leap_tries);
            Worker *res = lace_steal(__lace_worker, __lace_dq_head, thief);
            if (res == LACE_NOWORK) {
                YIELD_NEWFRAME();
                if ((LACE_LEAP_RANDOM) && (--attempts == 0)) { lace_steal_random(); attempts = 32; }
            } else if (res == LACE_STOLEN) {
                PR_COUNTSTEALS(__lace_worker, CTR_leaps);
            } else if (res == LACE_BUSY) {
                PR_COUNTSTEALS(__lace_worker, CTR_leap_busy);
            }
            atomic_thread_fence(memory_order_acquire);
            thief = t->thief;
        }

        /* POST-LEAP: really pop the finished task */
        /*            no need to decrease __lace_dq_head, since it is a local variable */
        atomic_thread_fence(memory_order_acquire);
        /*compiler_barrier();*/
        if (__lace_worker->allstolen == 0) {
            /* Assume: tail = split = head (pre-pop) */
            /* Now we do a real pop ergo either decrease tail,split,head or declare allstolen */
            Worker *wt = __lace_worker->_public;
            wt->allstolen = 1;
            __lace_worker->allstolen = 1;
        }
    }

    /*compiler_barrier();*/
    atomic_thread_fence(memory_order_acquire);
    atomic_store_explicit(&t->thief, THIEF_EMPTY, memory_order_relaxed);
    lace_time_event(__lace_worker, 4);
}